

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Version::RecordReadSample(Version *this,Slice internal_key)

{
  Slice internal_key_00;
  Slice user_key;
  bool bVar1;
  undefined1 local_60 [8];
  State state;
  ParsedInternalKey ikey;
  Version *this_local;
  Slice internal_key_local;
  
  internal_key_local.data_ = (char *)internal_key.size_;
  this_local = (Version *)internal_key.data_;
  ParsedInternalKey::ParsedInternalKey((ParsedInternalKey *)&state.matches);
  bVar1 = ParseInternalKey((Slice *)&this_local,(ParsedInternalKey *)&state.matches);
  if (bVar1) {
    state.stats.seek_file_level = 0;
    user_key.size_ = (size_t)ikey.user_key.data_;
    user_key.data_ = (char *)state._16_8_;
    internal_key_00.size_ = (size_t)internal_key_local.data_;
    internal_key_00.data_ = (char *)this_local;
    ForEachOverlapping(this,user_key,internal_key_00,local_60,
                       RecordReadSample(leveldb::Slice)::State::Match(void*,int,leveldb::
                       FileMetaData__);
    if (state.stats.seek_file_level < 2) {
      internal_key_local.size_._7_1_ = false;
    }
    else {
      internal_key_local.size_._7_1_ = UpdateStats(this,(GetStats *)local_60);
    }
  }
  else {
    internal_key_local.size_._7_1_ = false;
  }
  return internal_key_local.size_._7_1_;
}

Assistant:

bool Version::RecordReadSample(Slice internal_key) {
  ParsedInternalKey ikey;
  if (!ParseInternalKey(internal_key, &ikey)) {
    return false;
  }

  struct State {
    GetStats stats;  // Holds first matching file
    int matches;

    static bool Match(void* arg, int level, FileMetaData* f) {
      State* state = reinterpret_cast<State*>(arg);
      state->matches++;
      if (state->matches == 1) {
        // Remember first match.
        state->stats.seek_file = f;
        state->stats.seek_file_level = level;
      }
      // We can stop iterating once we have a second match.
      return state->matches < 2;
    }
  };

  State state;
  state.matches = 0;
  ForEachOverlapping(ikey.user_key, internal_key, &state, &State::Match);

  // Must have at least two matches since we want to merge across
  // files. But what if we have a single file that contains many
  // overwrites and deletions?  Should we have another mechanism for
  // finding such files?
  if (state.matches >= 2) {
    // 1MB cost is about 1 seek (see comment in Builder::Apply).
    return UpdateStats(state.stats);
  }
  return false;
}